

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

void __thiscall
VulkanHppGenerator::rescheduleRAIIHandle
          (VulkanHppGenerator *this,string *str,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
          *handle,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *listedHandles,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *specialFunctions)

{
  bool bVar1;
  reference ppVar2;
  vector<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>
  *this_00;
  reference p_Var3;
  pointer ppVar4;
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *this_01;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  byte local_451;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  local_440;
  string local_298;
  _Self local_278;
  _Self local_270;
  const_iterator handleIt;
  ParamData *param;
  const_iterator __end2;
  const_iterator __begin2;
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *__range2;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
  constructorIt;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>
  *__range1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  local_218;
  string local_70;
  _Self local_50;
  _Self local_48;
  const_iterator parentIt;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *specialFunctions_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *listedHandles_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  *handle_local;
  string *str_local;
  VulkanHppGenerator *this_local;
  
  pVar5 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(listedHandles,&handle->first);
  parentIt._M_node = (_Base_ptr)pVar5.first._M_node;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&(handle->second).parent);
  if ((!bVar1) &&
     (bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::contains(listedHandles,&(handle->second).parent), !bVar1)) {
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
         ::find(&this->m_handles,&(handle->second).parent);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
         ::end(&this->m_handles);
    bVar1 = std::operator==(&local_48,&local_50);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("parentIt != m_handles.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x4197,
                    "void VulkanHppGenerator::rescheduleRAIIHandle(std::string &, const std::pair<std::string, HandleData> &, std::set<std::string> &, const std::set<std::string> &) const"
                   );
    }
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>
             ::operator*(&local_48);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData,_true>
              (&local_218,ppVar2);
    generateRAIIHandle(&local_70,this,&local_218,listedHandles,specialFunctions);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (str,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
    ::~pair(&local_218);
  }
  this_00 = &(handle->second).constructorIts;
  __end1 = std::
           vector<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>
           ::begin(this_00);
  constructorIt._M_node =
       (_Base_ptr)
       std::
       vector<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>
       ::end(this_00);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_*,_std::vector<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>_>
                           (&__end1,(__normal_iterator<const_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_*,_std::vector<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>_>
                                     *)&constructorIt), ((bVar1 ^ 0xffU) & 1) != 0) {
    p_Var3 = __gnu_cxx::
             __normal_iterator<const_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_*,_std::vector<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>_>
             ::operator*(&__end1);
    __range2 = (vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                *)p_Var3->_M_node;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                           *)&__range2);
    this_01 = &(ppVar4->second).params;
    __end2 = std::
             vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
             begin(this_01);
    param = (ParamData *)
            std::
            vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
            end(this_01);
    while (bVar1 = __gnu_cxx::
                   operator==<const_VulkanHppGenerator::ParamData_*,_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_>
                             (&__end2,(__normal_iterator<const_VulkanHppGenerator::ParamData_*,_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_>
                                       *)&param), ((bVar1 ^ 0xffU) & 1) != 0) {
      handleIt._M_node =
           (_Base_ptr)
           __gnu_cxx::
           __normal_iterator<const_VulkanHppGenerator::ParamData_*,_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_>
           ::operator*(&__end2);
      local_270._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
           ::find(&this->m_handles,&(((reference)handleIt._M_node)->type).type);
      local_278._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
           ::end(&this->m_handles);
      bVar1 = std::operator==(&local_270,&local_278);
      local_451 = 0;
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::contains(listedHandles,(key_type *)(handleIt._M_node + 1));
        local_451 = bVar1 ^ 0xff;
      }
      if ((local_451 & 1) != 0) {
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>
                 ::operator*(&local_270);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
        ::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData,_true>
                  (&local_440,ppVar2);
        generateRAIIHandle(&local_298,this,&local_440,listedHandles,specialFunctions);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (str,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
        ::~pair(&local_440);
      }
      __gnu_cxx::
      __normal_iterator<const_VulkanHppGenerator::ParamData_*,_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_*,_std::vector<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void VulkanHppGenerator::rescheduleRAIIHandle( std::string &                              str,
                                               std::pair<std::string, HandleData> const & handle,
                                               std::set<std::string> &                    listedHandles,
                                               std::set<std::string> const &              specialFunctions ) const
{
  listedHandles.insert( handle.first );
  if ( !handle.second.parent.empty() && !listedHandles.contains( handle.second.parent ) )
  {
    auto parentIt = m_handles.find( handle.second.parent );
    assert( parentIt != m_handles.end() );
    str += generateRAIIHandle( *parentIt, listedHandles, specialFunctions );
  }

  for ( auto constructorIt : handle.second.constructorIts )
  {
    for ( auto const & param : constructorIt->second.params )
    {
      auto handleIt = m_handles.find( param.type.type );
      if ( handleIt != m_handles.end() && !listedHandles.contains( param.type.type ) )
      {
        str += generateRAIIHandle( *handleIt, listedHandles, specialFunctions );
      }
    }
  }
}